

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_prefix(FuncState *fs,UnOpr op,expdesc *e,int line)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  
  if (op < OPR_NOT) {
    iVar2 = constfolding(fs,op + 0xc,e,&luaK_prefix::ef);
    if (iVar2 != 0) {
      return;
    }
  }
  else {
    if (op == OPR_NOT) {
      luaK_dischargevars(fs,e);
      switch(e->k) {
      case VNIL:
      case VFALSE:
        e->k = VTRUE;
        break;
      case VTRUE:
      case VK:
      case VKFLT:
      case VKINT:
        e->k = VFALSE;
        break;
      case VNONRELOC:
      case VRELOCABLE:
        discharge2anyreg(fs,e);
        if (((e->k == VNONRELOC) && (((uint)(e->u).info >> 8 & 1) == 0)) &&
           ((int)(uint)fs->nactvar <= (e->u).info)) {
          fs->freereg = fs->freereg + 0xff;
        }
        iVar2 = luaK_code(fs,(e->u).info << 0x17 | 0x1b);
        (e->u).info = iVar2;
        e->k = VRELOCABLE;
        break;
      case VJMP:
        puVar3 = fs->f->code + (e->u).info;
        if ((0 < (long)(e->u).info) && ((char)luaP_opmodes[puVar3[-1] & 0x3f] < '\0')) {
          puVar3 = puVar3 + -1;
        }
        *puVar3 = (uint)((*puVar3 & 0x3fc0) == 0) << 6 | *puVar3 & 0xffffc03f;
      }
      iVar2 = e->t;
      iVar1 = e->f;
      e->f = iVar2;
      e->t = iVar1;
      removevalues(fs,iVar2);
      removevalues(fs,e->t);
      return;
    }
    if (op != OPR_LEN) {
      return;
    }
  }
  iVar2 = luaK_exp2anyreg(fs,e);
  if (((e->k == VNONRELOC) && (((uint)(e->u).info >> 8 & 1) == 0)) &&
     ((int)(uint)fs->nactvar <= (e->u).info)) {
    fs->freereg = fs->freereg + 0xff;
  }
  iVar2 = luaK_code(fs,iVar2 << 0x17 | op + 0x19);
  (e->u).info = iVar2;
  e->k = VRELOCABLE;
  fs->f->lineinfo[(long)fs->pc + -1] = line;
  return;
}

Assistant:

void luaK_prefix (FuncState *fs, UnOpr op, expdesc *e, int line) {
  static const expdesc ef = {VKINT, {0}, NO_JUMP, NO_JUMP};
  switch (op) {
    case OPR_MINUS: case OPR_BNOT:  /* use 'ef' as fake 2nd operand */
      if (constfolding(fs, op + LUA_OPUNM, e, &ef))
        break;
      /* FALLTHROUGH */
    case OPR_LEN:
      codeunexpval(fs, cast(OpCode, op + OP_UNM), e, line);
      break;
    case OPR_NOT: codenot(fs, e); break;
    default: lua_assert(0);
  }
}